

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

void __thiscall helics::ValueFederateManager::clearUpdates(ValueFederateManager *this)

{
  Input *this_00;
  int iVar1;
  Input **ppIVar2;
  Input **ppIVar3;
  int iVar4;
  ulong uVar5;
  handle local_40;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_40,&this->inputs);
  if (((local_40.data)->dataStorage).csize == 0) {
    uVar5 = (ulong)((local_40.data)->dataStorage).bsize;
    ppIVar3 = ((local_40.data)->dataStorage).dataptr;
    if (uVar5 != 0x20) {
      ppIVar3 = ppIVar3 + ((local_40.data)->dataStorage).dataSlotIndex;
      this_00 = *ppIVar3 + uVar5;
      goto LAB_002151d4;
    }
    if (ppIVar3 == (Input **)0x0) {
      ppIVar3 = &gmlc::containers::
                 StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                 emptyValue;
    }
    else {
      ppIVar3 = ppIVar3 + (long)((local_40.data)->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppIVar3 = ((local_40.data)->dataStorage).dataptr;
  }
  this_00 = *ppIVar3;
  uVar5 = 0;
LAB_002151d4:
  iVar1 = ((local_40.data)->dataStorage).bsize;
  ppIVar2 = ((local_40.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppIVar2 == (Input **)0x0) {
      ppIVar2 = &gmlc::containers::
                 StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                 emptyValue;
    }
    else {
      ppIVar2 = ppIVar2 + (long)((local_40.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppIVar2 = ppIVar2 + ((local_40.data)->dataStorage).dataSlotIndex;
  }
  while ((iVar4 = (int)uVar5, iVar4 != iVar1 || (ppIVar3 != ppIVar2))) {
    Input::clearUpdate(this_00);
    uVar5 = (ulong)(iVar4 + 1U);
    if (iVar4 < 0x1f) {
      this_00 = this_00 + 1;
    }
    else {
      ppIVar3 = ppIVar3 + (ulong)(iVar4 - 0x1fU >> 5) + 1;
      uVar5 = (ulong)(iVar4 + 1U & 0x1f);
      this_00 = *ppIVar3 + uVar5;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
  return;
}

Assistant:

void ValueFederateManager::clearUpdates()
{
    inputs.lock()->apply([](auto& inp) { inp.clearUpdate(); });
}